

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O3

_Bool Curl_uint_tbl_first(uint_tbl *tbl,uint *pkey,void **pentry)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  
  if (pentry == (void **)0x0 || pkey == (uint *)0x0) {
    return false;
  }
  if (tbl->nentries != 0) {
    uVar2 = (ulong)tbl->nrows;
    uVar5 = 0;
    if (uVar2 == 0) {
      _Var1 = false;
      pvVar4 = (void *)0x0;
      uVar5 = 0xffffffff;
      goto LAB_0015f87a;
    }
    pvVar4 = *tbl->rows;
    _Var1 = true;
    if (pvVar4 != (void *)0x0) goto LAB_0015f87a;
    uVar3 = 0;
    do {
      if (uVar2 - 1 == uVar3) goto LAB_0015f861;
      pvVar4 = tbl->rows[uVar3 + 1];
      uVar3 = uVar3 + 1;
    } while (pvVar4 == (void *)0x0);
    *pkey = (uint)uVar3;
    *pentry = pvVar4;
    if (uVar3 < uVar2) {
      return true;
    }
  }
LAB_0015f861:
  pvVar4 = (void *)0x0;
  uVar5 = 0xffffffff;
  _Var1 = false;
LAB_0015f87a:
  *pkey = uVar5;
  *pentry = pvVar4;
  return _Var1;
}

Assistant:

bool Curl_uint_tbl_first(struct uint_tbl *tbl,
                         unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(tbl->nentries && uint_tbl_next_at(tbl, 0, pkey, pentry))
    return TRUE;
  DEBUGASSERT(!tbl->nentries);
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}